

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDefaultSoftBodySolver.cpp
# Opt level: O0

void __thiscall btDefaultSoftBodySolver::predictMotion(btDefaultSoftBodySolver *this,float timeStep)

{
  bool bVar1;
  int iVar2;
  btCollisionObject *in_RDI;
  btSoftBody *psb;
  int i;
  btScalar in_stack_0000029c;
  btSoftBody *in_stack_000002a0;
  int local_10;
  
  for (local_10 = 0;
      iVar2 = btAlignedObjectArray<btSoftBody_*>::size
                        ((btAlignedObjectArray<btSoftBody_*> *)
                         ((in_RDI->m_worldTransform).m_basis.m_el + 1)), local_10 < iVar2;
      local_10 = local_10 + 1) {
    btAlignedObjectArray<btSoftBody_*>::operator[]
              ((btAlignedObjectArray<btSoftBody_*> *)((in_RDI->m_worldTransform).m_basis.m_el + 1),
               local_10);
    bVar1 = btCollisionObject::isActive(in_RDI);
    if (bVar1) {
      btSoftBody::predictMotion(in_stack_000002a0,in_stack_0000029c);
    }
  }
  return;
}

Assistant:

void btDefaultSoftBodySolver::predictMotion( float timeStep )
{
	for ( int i=0; i < m_softBodySet.size(); ++i)
	{
		btSoftBody*	psb = m_softBodySet[i];

		if (psb->isActive())
		{
			psb->predictMotion(timeStep);		
		}
	}
}